

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.cpp
# Opt level: O0

DataDictionary * __thiscall
FIX::DataDictionaryProvider::getApplicationDataDictionary
          (DataDictionaryProvider *this,ApplVerID *applVerID)

{
  bool bVar1;
  string *__x;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  const_iterator find;
  ApplVerID *applVerID_local;
  DataDictionaryProvider *this_local;
  
  find._M_node = (_Base_ptr)applVerID;
  __x = StringField::operator_cast_to_string_(&applVerID->super_StringField);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
       ::find(&this->m_applicationDictionaries,__x);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
       ::end(&this->m_applicationDictionaries);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>
             ::operator->(&local_28);
    this_local = (DataDictionaryProvider *)
                 std::
                 __shared_ptr_access<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<FIX::DataDictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&ppVar2->second);
  }
  else {
    this_local = (DataDictionaryProvider *)&this->emptyDataDictionary;
  }
  return (DataDictionary *)this_local;
}

Assistant:

EXCEPT(DataDictionaryNotFound) {
  std::map<std::string, std::shared_ptr<DataDictionary>>::const_iterator find
      = m_applicationDictionaries.find(applVerID);
  if (find != m_applicationDictionaries.end()) {
    return *find->second;
  }

  return emptyDataDictionary;
}